

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp sexp_make_primitive_env_op(sexp ctx,sexp self,sexp_sint_t n,sexp version)

{
  uchar *puVar1;
  sexp psVar2;
  long lVar3;
  sexp_opcode_struct *psVar4;
  anon_union_24768_35_b8e82fc1_for_value *paVar5;
  long lVar6;
  byte bVar7;
  sexp op;
  sexp name;
  sexp e;
  sexp sym;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver4;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  undefined1 local_88 [8];
  undefined1 local_80 [8];
  sexp local_78;
  sexp local_70;
  sexp *local_68;
  undefined1 auStack_60 [24];
  undefined1 local_48 [40];
  
  bVar7 = 0;
  local_48._16_8_ = local_88;
  local_68 = &local_78;
  local_78 = (sexp)0x43e;
  local_48._24_8_ = &local_68;
  local_88 = (undefined1  [8])&DAT_0000043e;
  local_48._8_8_ = local_48 + 0x10;
  local_48._0_8_ = &local_70;
  local_70 = (sexp)&DAT_0000043e;
  auStack_60._16_8_ = local_48;
  auStack_60._8_8_ = local_80;
  local_80 = (undefined1  [8])&DAT_0000043e;
  auStack_60._0_8_ = (ctx->value).context.saves;
  (ctx->value).context.saves = (sexp_gc_var_t *)local_48._24_8_;
  (ctx->value).context.saves = (sexp_gc_var_t *)local_48._8_8_;
  (ctx->value).context.saves = (sexp_gc_var_t *)auStack_60._16_8_;
  (ctx->value).context.saves = (sexp_gc_var_t *)(auStack_60 + 8);
  local_78 = sexp_make_null_env_op
                       (ctx,(sexp)local_48._8_8_,(sexp_sint_t)local_88,(sexp)local_48._24_8_);
  if (sexp_primitive_opcodes->op_class != '\0') {
    lVar6 = 0x68;
    psVar4 = sexp_primitive_opcodes;
    do {
      local_88 = (undefined1  [8])sexp_alloc_tagged_aux(ctx,0x70,0x1b);
      paVar5 = &((sexp)local_88)->value;
      for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
        (paVar5->vector).length = (sexp_uint_t)psVar4->name;
        psVar4 = (sexp_opcode_struct *)((long)psVar4 + (ulong)bVar7 * -0x10 + 8);
        paVar5 = (anon_union_24768_35_b8e82fc1_for_value *)((long)paVar5 + (ulong)bVar7 * -0x10 + 8)
        ;
      }
      local_80 = (undefined1  [8])sexp_intern(ctx,(char *)(((sexp)local_88)->value).type.name,-1);
      psVar2 = sexp_c_string(ctx,(char *)(((anon_union_24768_35_b8e82fc1_for_value *)
                                          ((long)local_88 + 8))->type).name,-1);
      (((anon_union_24768_35_b8e82fc1_for_value *)((long)local_88 + 8))->type).name = psVar2;
      if ((((((anon_union_24768_35_b8e82fc1_for_value *)((long)local_88 + 8))->opcode).flags & 2) ==
           0) || (psVar2 = (((anon_union_24768_35_b8e82fc1_for_value *)((long)local_88 + 8))->type).
                           cpl, psVar2 == (sexp)0x0)) {
        if (((anon_union_24768_35_b8e82fc1_for_value *)((long)local_88 + 8))->flonum_bits[0x58] ==
            '\n') {
          psVar2 = sexp_cons_op(ctx,(sexp)0x0,2,(sexp)local_80,(sexp)&DAT_0000003e);
          goto LAB_00127696;
        }
      }
      else {
        local_70 = sexp_intern(ctx,(char *)psVar2,-1);
        psVar2 = sexp_env_cell_loc(ctx,local_78,local_70,0,(sexp_conflict *)0x0);
        if (psVar2 == (sexp)0x0) {
          psVar2 = (sexp)&DAT_0000003e;
        }
        else {
          psVar2 = (psVar2->value).type.cpl;
        }
LAB_00127696:
        (((anon_union_24768_35_b8e82fc1_for_value *)((long)local_88 + 8))->type).cpl = psVar2;
      }
      if ((((anon_union_24768_35_b8e82fc1_for_value *)((long)local_88 + 8))->flonum_bits[0x58] ==
           '\v') &&
         (psVar2 = (((anon_union_24768_35_b8e82fc1_for_value *)((long)local_88 + 8))->type).slots,
         psVar2 != (sexp)0x0)) {
        psVar2 = sexp_c_string(ctx,(char *)psVar2,-1);
        (((anon_union_24768_35_b8e82fc1_for_value *)((long)local_88 + 8))->type).slots = psVar2;
      }
      sexp_env_define(ctx,local_78,(sexp)local_80,(sexp)local_88);
      psVar4 = (sexp_opcode_struct *)((long)&sexp_primitive_opcodes->name + lVar6);
      puVar1 = &sexp_primitive_opcodes->op_class + lVar6;
      lVar6 = lVar6 + 0x68;
    } while (*puVar1 != '\0');
  }
  (ctx->value).context.saves = (sexp_gc_var_t *)auStack_60._0_8_;
  return local_78;
}

Assistant:

sexp sexp_make_primitive_env_op (sexp ctx, sexp self, sexp_sint_t n, sexp version) {
  int i;
  sexp_gc_var4(e, op, sym, name);
  sexp_gc_preserve4(ctx, e, op, sym, name);
  e = sexp_make_null_env(ctx, version);
  for (i=0; sexp_primitive_opcodes[i].op_class; i++) {
    op = sexp_copy_opcode(ctx, &sexp_primitive_opcodes[i]);
    name = sexp_intern(ctx, (char*)sexp_opcode_name(op), -1);
    sexp_opcode_name(op) = sexp_c_string(ctx, (char*)sexp_opcode_name(op), -1);
    if (sexp_opcode_opt_param_p(op) && sexp_opcode_data(op)) {
      sym = sexp_intern(ctx, (char*)sexp_opcode_data(op), -1);
      sexp_opcode_data(op) = sexp_env_ref(ctx, e, sym, SEXP_FALSE);
    } else if (sexp_opcode_class(op) == SEXP_OPC_PARAMETER) {
      sexp_opcode_data(op) = sexp_cons(ctx, name, SEXP_FALSE);
    }
    if (sexp_opcode_class(op) == SEXP_OPC_FOREIGN && sexp_opcode_data2(op)) {
      sexp_opcode_data2(op) = sexp_c_string(ctx, (char*)sexp_opcode_data2(op), -1);
    }
    sexp_env_define(ctx, e, name, op);
  }
  sexp_gc_release4(ctx);
  return e;
}